

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

OPJ_BOOL opj_set_decoded_components
                   (opj_codec_t *p_codec,OPJ_UINT32 numcomps,OPJ_UINT32 *comps_indices,
                   OPJ_BOOL apply_color_transforms)

{
  OPJ_BOOL OVar1;
  char *fmt;
  undefined4 in_register_00000034;
  
  if (p_codec != (opj_codec_t *)0x0) {
    if (*(int *)(p_codec + 0x12) == 0) {
      fmt = 
      "Codec provided to the opj_set_decoded_components function is not a decompressor handler.\n";
    }
    else {
      if (apply_color_transforms == 0) {
        OVar1 = (*(code *)p_codec[10])
                          (p_codec[0xb],CONCAT44(in_register_00000034,numcomps),comps_indices,
                           p_codec + 0xc,p_codec[10]);
        return OVar1;
      }
      fmt = "apply_color_transforms = OPJ_TRUE is not supported.\n";
    }
    opj_event_msg((opj_event_mgr_t *)(p_codec + 0xc),1,fmt);
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_decoded_components(opj_codec_t *p_codec,
        OPJ_UINT32 numcomps,
        const OPJ_UINT32* comps_indices,
        OPJ_BOOL apply_color_transforms)
{
    if (p_codec) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            opj_event_msg(&(l_codec->m_event_mgr), EVT_ERROR,
                          "Codec provided to the opj_set_decoded_components function is not a decompressor handler.\n");
            return OPJ_FALSE;
        }

        if (apply_color_transforms) {
            opj_event_msg(&(l_codec->m_event_mgr), EVT_ERROR,
                          "apply_color_transforms = OPJ_TRUE is not supported.\n");
            return OPJ_FALSE;
        }

        return  l_codec->m_codec_data.m_decompression.opj_set_decoded_components(
                    l_codec->m_codec,
                    numcomps,
                    comps_indices,
                    &(l_codec->m_event_mgr));
    }
    return OPJ_FALSE;
}